

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall CoreML::Model::Model(Model *this,Model *proto)

{
  this->_vptr_Model = (_func_int **)&PTR__Model_0076fea8;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<CoreML::Specification::Model,CoreML::Specification::Model_const&>
            ((Model *)&stack0xffffffffffffffe0);
  std::__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  downgradeSpecificationVersion(this);
  return;
}

Assistant:

Model::Model(const Specification::Model& proto) {
        m_spec = std::make_shared<Specification::Model>(proto);
        // We need to check this here because the proto could be overly strict
        downgradeSpecificationVersion();
    }